

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::keyboardSearch(QTreeView *this,QString *search)

{
  QPersistentModelIndex *this_00;
  QTreeViewPrivate *this_01;
  QAbstractItemModel *pQVar1;
  quintptr *pqVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long *plVar13;
  ulong uVar14;
  QTreeViewItem *pQVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  uint local_ec;
  undefined8 local_d8;
  QModelIndex *pQStack_d0;
  QAbstractItemModel *local_c8;
  PrivateShared *local_b8;
  QModelIndex *pQStack_b0;
  QAbstractItemModel *local_a8;
  QString local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
  this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
  iVar9 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_58);
  if (iVar9 == 0) goto LAB_0059e952;
  pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,this_00);
  iVar9 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,(QModelIndex *)&local_78);
  if (iVar9 == 0) goto LAB_0059e952;
  if (((this_01->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this_01->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_01->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this_01->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  if ((this_01->viewItems).d.size == 0) goto LAB_0059e952;
  local_78._0_4_ = -1;
  local_78._4_4_ = -1;
  uStack_70 = (QModelIndex *)0x0;
  tStack_68.ptr = (QAbstractItemModel *)0x0;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
  if ((((int)local_58._0_4_ < 0) || ((long)local_58.shared < 0)) ||
     ((QAbstractItemModel *)local_58._16_8_ == (QAbstractItemModel *)0x0)) {
    pQVar15 = (this_01->viewItems).d.ptr;
    tStack_68.ptr = (pQVar15->index).m.ptr;
    uVar21 = (pQVar15->index).r;
    uVar22 = (pQVar15->index).c;
    uVar23 = (undefined4)(pQVar15->index).i;
    uVar24 = *(undefined4 *)((long)&(pQVar15->index).i + 4);
  }
  else {
    QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
    tStack_68.ptr = (QAbstractItemModel *)local_58._16_8_;
    uVar21 = local_58._0_4_;
    uVar22 = local_58._4_4_;
    uVar23 = local_58._8_4_;
    uVar24 = local_58._12_4_;
  }
  local_78 = (PrivateShared *)CONCAT44(uVar22,uVar21);
  uStack_70 = (QModelIndex *)CONCAT44(uVar24,uVar23);
  cVar8 = QElapsedTimer::isValid();
  if (cVar8 == '\0') {
    QElapsedTimer::start();
LAB_0059e345:
    QString::operator=(&(this_01->super_QAbstractItemViewPrivate).keyboardInput,(QString *)search);
    QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
    bVar20 = false;
    if ((-1 < (int)local_58._0_4_) && (-1 < (long)local_58.shared)) {
      bVar20 = (QAbstractItemModel *)local_58._16_8_ != (QAbstractItemModel *)0x0;
    }
  }
  else {
    lVar12 = QElapsedTimer::restart();
    if (((search->d).size == 0) || (iVar9 = QApplication::keyboardInputInterval(), iVar9 < lVar12))
    goto LAB_0059e345;
    QString::append((QString *)&(this_01->super_QAbstractItemViewPrivate).keyboardInput);
    bVar20 = false;
  }
  uVar14 = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.size;
  if (uVar14 < 2) {
    bVar19 = false;
    bVar7 = false;
    if (bVar20) goto LAB_0059e3d7;
  }
  else {
    iVar9 = QString::count((QChar)((short)this_01 + L'ϰ'),
                           (uint)(ushort)(this_01->super_QAbstractItemViewPrivate).keyboardInput.d.
                                         ptr[uVar14 - 1]);
    bVar19 = (long)iVar9 == (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.size;
    bVar7 = bVar19;
    if (bVar20 || bVar19) {
LAB_0059e3d7:
      bVar19 = bVar7;
      indexBelow((QModelIndex *)&local_58,this,(QModelIndex *)&local_78);
      if ((((int)local_58._0_4_ < 0) || ((long)local_58.shared < 0)) ||
         ((QAbstractItemModel *)local_58._16_8_ == (QAbstractItemModel *)0x0)) {
        pQVar15 = (this_01->viewItems).d.ptr;
        uStack_70 = (QModelIndex *)(pQVar15->index).i;
        tStack_68.ptr = (pQVar15->index).m.ptr;
        bVar20 = local_78._4_4_ != (pQVar15->index).c;
        local_78 = *(PrivateShared **)&pQVar15->index;
        if (bVar20) {
          if (tStack_68.ptr == (QAbstractItemModel *)0x0) {
            local_58._forAlignment = -NAN;
            local_58._8_8_ = (QModelIndex *)0x0;
            local_58._16_8_ = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)tStack_68.ptr + 0x70))(&local_58,tStack_68.ptr,(pQVar15->index).r)
            ;
          }
          tStack_68.ptr = (QAbstractItemModel *)local_58._16_8_;
          local_78 = local_58.shared;
          uStack_70 = (QModelIndex *)local_58._8_8_;
        }
      }
      else {
        indexBelow((QModelIndex *)&local_58,this,(QModelIndex *)&local_78);
        tStack_68.ptr = (QAbstractItemModel *)local_58._16_8_;
        local_78 = local_58.shared;
        uStack_70 = (QModelIndex *)local_58._8_8_;
      }
    }
  }
  uVar10 = QTreeViewPrivate::viewIndex(this_01,(QModelIndex *)&local_78);
  if (-1 < (int)uVar10) {
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (bVar19) {
      QString::QString(&local_98,
                       (QChar)*(this_01->super_QAbstractItemViewPrivate).keyboardInput.d.ptr);
    }
    else {
      local_98.d.d = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.d;
      local_98.d.ptr = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.ptr;
      local_98.d.size = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.size;
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    uVar14 = (this_01->viewItems).d.size;
    if (uVar14 == 0) {
      local_ec = 0xffffffff;
      uVar17 = 0xffffffff;
    }
    else {
      pQVar15 = (this_01->viewItems).d.ptr;
      uVar16 = 0xffffffff;
      lVar12 = 0x1c;
      uVar18 = 0;
      uVar17 = 0xffffffff;
      local_ec = 0xffffffff;
      do {
        if ((int)uVar16 < (int)(uint)*(ushort *)((long)&(pQVar15->index).c + lVar12)) {
          plVar13 = (long *)((long)pQVar15 + lVar12 + -0x1c);
          local_b8 = (PrivateShared *)*plVar13;
          pqVar2 = (quintptr *)((long)pQVar15 + lVar12 + -0x14);
          pQStack_b0 = (QModelIndex *)*pqVar2;
          local_a8 = *(QAbstractItemModel **)((long)pQVar15 + lVar12 + -0xc);
          if (0 < local_78._4_4_) {
            if (local_a8 == (QAbstractItemModel *)0x0) {
              local_58._forAlignment = -NAN;
              local_58._8_8_ = (QModelIndex *)0x0;
              local_58._16_8_ = (QAbstractItemModel *)0x0;
              uVar4 = local_58._forAlignment;
              uVar5 = local_58._8_8_;
              uVar6 = local_58._16_8_;
            }
            else {
              uVar4 = (PrivateShared *)*plVar13;
              uVar5 = (QModelIndex *)*pqVar2;
              uVar6 = local_a8;
              if (*(int *)((long)pQVar15 + lVar12 + -0x18) != local_78._4_4_) {
                (**(code **)(*(long *)local_a8 + 0x70))
                          (&local_58,local_a8,(int)*plVar13,local_78._4_4_,&local_b8);
                uVar4 = local_58._0_8_;
                uVar5 = local_58._8_8_;
                uVar6 = local_58._16_8_;
              }
            }
            local_58._16_8_ = uVar6;
            local_58._8_8_ = uVar5;
            local_58.shared = (PrivateShared *)uVar4;
            local_a8 = (QAbstractItemModel *)local_58._16_8_;
            local_b8 = local_58.shared;
            pQStack_b0 = (QModelIndex *)local_58._8_8_;
          }
          if (local_a8 == (QAbstractItemModel *)0x0) {
            local_58._forAlignment = -NAN;
            local_58._8_8_ = (QModelIndex *)0x0;
            local_58._16_8_ = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_a8 + 0x68))(&local_58,local_a8,&local_b8);
          }
          if (tStack_68.ptr == (QAbstractItemModel *)0x0) {
            local_d8 = (QArrayData *)0xffffffffffffffff;
            pQStack_d0 = (QModelIndex *)0x0;
            local_c8 = (QAbstractItemModel *)0x0;
            local_d8._0_4_ = -1;
          }
          else {
            (**(code **)(*(long *)tStack_68.ptr + 0x68))(&local_d8,tStack_68.ptr,&local_78);
          }
          if (local_58._0_4_ == (int)local_d8) {
            if (((local_58._4_4_ == local_d8._4_4_) && ((QModelIndex *)local_58._8_8_ == pQStack_d0)
                ) && ((QAbstractItemModel *)local_58._16_8_ == local_c8)) {
              local_a8 = tStack_68.ptr;
              local_b8 = local_78;
              pQStack_b0 = uStack_70;
            }
          }
          local_c8 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_d8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          pQStack_d0 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
          ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_98);
          (**(code **)(*(long *)pQVar1 + 0x150))(&local_d8,pQVar1,&local_b8,0,&local_58,1,0x22);
          ::QVariant::~QVariant((QVariant *)&local_58);
          uVar16 = uVar17;
          uVar3 = local_ec;
          if (local_c8 != (QAbstractItemModel *)0x0) {
            uVar11 = QTreeViewPrivate::viewIndex(this_01,pQStack_d0);
            if (uVar11 < uVar10) {
              uVar16 = uVar11;
              if ((uVar17 != 0xffffffff) && (uVar16 = uVar17, (int)uVar11 < (int)uVar17)) {
                uVar16 = uVar11;
              }
            }
            else if ((((int)uVar10 <= (int)uVar11) && (uVar3 = uVar11, local_ec != 0xffffffff)) &&
                    (uVar3 = local_ec, (int)uVar11 < (int)local_ec)) {
              uVar3 = uVar11;
            }
          }
          local_ec = uVar3;
          if (local_d8 != (QArrayData *)0x0) {
            LOCK();
            (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_d8,0x18,0x10);
            }
          }
          pQVar15 = (this_01->viewItems).d.ptr;
          uVar14 = (this_01->viewItems).d.size;
          uVar17 = uVar16;
        }
        uVar16 = (uint)*(ushort *)((long)&(pQVar15->index).c + lVar12);
        uVar18 = uVar18 + 1;
        lVar12 = lVar12 + 0x28;
      } while (uVar18 < uVar14);
    }
    local_58._forAlignment = -NAN;
    local_58._8_8_ = (QModelIndex *)0x0;
    local_58._16_8_ = (QAbstractItemModel *)0x0;
    if ((-1 < (int)local_ec) || (local_ec = uVar17, -1 < (int)uVar17)) {
      pQVar15 = (this_01->viewItems).d.ptr;
      local_58._16_8_ = pQVar15[local_ec].index.m.ptr;
      pQVar15 = pQVar15 + local_ec;
      local_58.shared = (PrivateShared *)*(undefined8 *)&pQVar15->index;
      local_58._8_8_ = (pQVar15->index).i;
    }
    uVar21 = local_58._0_4_;
    if (0 < local_78._4_4_) {
      if ((QAbstractItemModel *)local_58._16_8_ == (QAbstractItemModel *)0x0) {
        local_b8 = (PrivateShared *)0xffffffffffffffff;
        pQStack_b0 = (QModelIndex *)0x0;
        local_a8 = (QAbstractItemModel *)0x0;
      }
      else if (local_58._4_4_ == local_78._4_4_) {
        local_a8 = (QAbstractItemModel *)local_58._16_8_;
        local_b8 = local_58.shared;
        pQStack_b0 = (QModelIndex *)local_58._8_8_;
      }
      else {
        (**(code **)(*(long *)local_58._16_8_ + 0x70))(&local_b8);
      }
      local_58._16_8_ = local_a8;
      local_58._0_8_ = local_b8;
      uVar4 = local_58._0_8_;
      local_58._8_8_ = pQStack_b0;
      local_58._0_4_ = SUB84(local_b8,0);
      uVar21 = local_58._0_4_;
      local_58._0_8_ = uVar4;
    }
    if (((-1 < (int)uVar21) && (-1 < (long)local_58.shared)) &&
       ((QAbstractItemModel *)local_58._16_8_ != (QAbstractItemModel *)0x0)) {
      QAbstractItemView::setCurrentIndex((QAbstractItemView *)this,(QModelIndex *)&local_58);
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
LAB_0059e952:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::keyboardSearch(const QString &search)
{
    Q_D(QTreeView);
    if (!d->model->rowCount(d->root) || !d->model->columnCount(d->root))
        return;

    // Do a relayout nows, so that we can utilize viewItems
    d->executePostedLayout();
    if (d->viewItems.isEmpty())
        return;

    QModelIndex start;
    if (currentIndex().isValid())
        start = currentIndex();
    else
        start = d->viewItems.at(0).index;

    bool skipRow = false;
    bool keyboardTimeWasValid = d->keyboardInputTime.isValid();
    qint64 keyboardInputTimeElapsed;
    if (keyboardTimeWasValid)
        keyboardInputTimeElapsed = d->keyboardInputTime.restart();
    else
        d->keyboardInputTime.start();
    if (search.isEmpty() || !keyboardTimeWasValid
        || keyboardInputTimeElapsed > QApplication::keyboardInputInterval()) {
        d->keyboardInput = search;
        skipRow = currentIndex().isValid(); //if it is not valid we should really start at QModelIndex(0,0)
    } else {
        d->keyboardInput += search;
    }

    // special case for searches with same key like 'aaaaa'
    bool sameKey = false;
    if (d->keyboardInput.size() > 1) {
        int c = d->keyboardInput.count(d->keyboardInput.at(d->keyboardInput.size() - 1));
        sameKey = (c == d->keyboardInput.size());
        if (sameKey)
            skipRow = true;
    }

    // skip if we are searching for the same key or a new search started
    if (skipRow) {
        if (indexBelow(start).isValid()) {
            start = indexBelow(start);
        } else {
            const int origCol = start.column();
            start = d->viewItems.at(0).index;
            if (origCol != start.column())
                start = start.sibling(start.row(), origCol);
        }
    }

    int startIndex = d->viewIndex(start);
    if (startIndex <= -1)
        return;

    int previousLevel = -1;
    int bestAbove = -1;
    int bestBelow = -1;
    QString searchString = sameKey ? QString(d->keyboardInput.at(0)) : d->keyboardInput;
    for (int i = 0; i < d->viewItems.size(); ++i) {
        if ((int)d->viewItems.at(i).level > previousLevel) {
            QModelIndex searchFrom = d->viewItems.at(i).index;
            if (start.column() > 0)
                searchFrom = searchFrom.sibling(searchFrom.row(), start.column());
            if (searchFrom.parent() == start.parent())
                searchFrom = start;
            QModelIndexList match = d->model->match(searchFrom, Qt::DisplayRole, searchString);
            if (match.size()) {
                int hitIndex = d->viewIndex(match.at(0));
                if (hitIndex >= 0 && hitIndex < startIndex)
                    bestAbove = bestAbove == -1 ? hitIndex : qMin(hitIndex, bestAbove);
                else if (hitIndex >= startIndex)
                    bestBelow = bestBelow == -1 ? hitIndex : qMin(hitIndex, bestBelow);
            }
        }
        previousLevel = d->viewItems.at(i).level;
    }

    QModelIndex index;
    if (bestBelow > -1)
        index = d->viewItems.at(bestBelow).index;
    else if (bestAbove > -1)
        index = d->viewItems.at(bestAbove).index;

    if (start.column() > 0)
        index = index.sibling(index.row(), start.column());

    if (index.isValid())
        setCurrentIndex(index);
}